

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void re2::AppendCCChar(string *t,Rune r)

{
  char *pcVar1;
  Rune r_local;
  string *t_local;
  
  if ((r < 0x20) || (0x7e < r)) {
    switch(r) {
    case 9:
      std::__cxx11::string::append((char *)t);
      break;
    case 10:
      std::__cxx11::string::append((char *)t);
      break;
    default:
      if (r < 0x100) {
        StringAppendF(t,"\\x%02x",(ulong)(uint)r);
      }
      else {
        StringAppendF(t,"\\x{%x}",(ulong)(uint)r);
      }
      break;
    case 0xc:
      std::__cxx11::string::append((char *)t);
      break;
    case 0xd:
      std::__cxx11::string::append((char *)t);
    }
  }
  else {
    pcVar1 = strchr("[]^-\\",r);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::append((char *)t);
    }
    std::__cxx11::string::append((ulong)t,'\x01');
  }
  return;
}

Assistant:

static void AppendCCChar(string* t, Rune r) {
  if (0x20 <= r && r <= 0x7E) {
    if (strchr("[]^-\\", r))
      t->append("\\");
    t->append(1, static_cast<char>(r));
    return;
  }
  switch (r) {
    default:
      break;

    case '\r':
      t->append("\\r");
      return;

    case '\t':
      t->append("\\t");
      return;

    case '\n':
      t->append("\\n");
      return;

    case '\f':
      t->append("\\f");
      return;
  }

  if (r < 0x100) {
    StringAppendF(t, "\\x%02x", static_cast<int>(r));
    return;
  }
  StringAppendF(t, "\\x{%x}", static_cast<int>(r));
}